

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch.cc
# Opt level: O2

Status __thiscall leveldb::WriteBatch::Iterate(WriteBatch *this,Handler *handler)

{
  long lVar1;
  char cVar2;
  bool bVar3;
  long *in_RDX;
  Slice *msg2;
  int iVar4;
  Slice *msg;
  long in_FS_OFFSET;
  Slice local_88;
  Slice local_78;
  Slice value;
  Slice key;
  Slice input;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  input.data_ = (char *)handler->_vptr_Handler;
  input.size_ = (size_t)handler[1]._vptr_Handler;
  if (input.size_ < (_func_int **)0xc) {
    msg = &key;
    key.data_ = "malformed WriteBatch (too small)";
    key.size_ = 0x20;
    msg2 = &value;
    value.data_ = "";
    value.size_ = 0;
  }
  else {
    Slice::remove_prefix(&input,0xc);
    key.data_ = "";
    key.size_ = 0;
    value.data_ = "";
    value.size_ = 0;
    iVar4 = 0;
    while (input.size_ != 0) {
      cVar2 = Slice::operator[](&input,0);
      Slice::remove_prefix(&input,1);
      if (cVar2 != '\0') {
        if (cVar2 == '\x01') {
          bVar3 = GetLengthPrefixedSlice(&input,&key);
          if (bVar3) {
            bVar3 = GetLengthPrefixedSlice(&input,&value);
            if (bVar3) {
              (**(code **)(*in_RDX + 0x10))();
              goto LAB_00a528e7;
            }
          }
          local_78.data_ = "bad WriteBatch Put";
          local_78.size_ = 0x12;
        }
        else {
          local_78.data_ = "unknown WriteBatch tag";
          local_78.size_ = 0x16;
        }
        goto LAB_00a52967;
      }
      bVar3 = GetLengthPrefixedSlice(&input,&key);
      if (!bVar3) {
        local_78.data_ = "bad WriteBatch Delete";
        local_78.size_ = 0x15;
        goto LAB_00a52967;
      }
      (**(code **)(*in_RDX + 0x18))();
LAB_00a528e7:
      iVar4 = iVar4 + 1;
    }
    if (*(int *)(handler->_vptr_Handler + 1) == iVar4) {
      (this->rep_)._M_dataplus._M_p = (pointer)0x0;
      goto LAB_00a52987;
    }
    local_78.data_ = "WriteBatch has wrong count";
    local_78.size_ = 0x1a;
LAB_00a52967:
    msg = &local_78;
    msg2 = &local_88;
    local_88.data_ = "";
    local_88.size_ = 0;
  }
  Status::Corruption((Status *)this,msg,msg2);
LAB_00a52987:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status WriteBatch::Iterate(Handler* handler) const {
  Slice input(rep_);
  if (input.size() < kHeader) {
    return Status::Corruption("malformed WriteBatch (too small)");
  }

  input.remove_prefix(kHeader);
  Slice key, value;
  int found = 0;
  while (!input.empty()) {
    found++;
    char tag = input[0];
    input.remove_prefix(1);
    switch (tag) {
      case kTypeValue:
        if (GetLengthPrefixedSlice(&input, &key) &&
            GetLengthPrefixedSlice(&input, &value)) {
          handler->Put(key, value);
        } else {
          return Status::Corruption("bad WriteBatch Put");
        }
        break;
      case kTypeDeletion:
        if (GetLengthPrefixedSlice(&input, &key)) {
          handler->Delete(key);
        } else {
          return Status::Corruption("bad WriteBatch Delete");
        }
        break;
      default:
        return Status::Corruption("unknown WriteBatch tag");
    }
  }
  if (found != WriteBatchInternal::Count(this)) {
    return Status::Corruption("WriteBatch has wrong count");
  } else {
    return Status::OK();
  }
}